

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heady.hpp
# Opt level: O0

void Heady::Detail::FindAndProcessLocalIncludes
               (list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                *dirEntries,string *include,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *processed,string *outputText)

{
  string *dirEntries_00;
  bool bVar1;
  reference dirEntry;
  _Self local_88 [3];
  string local_70 [32];
  _List_const_iterator<std::filesystem::__cxx11::directory_entry> local_50;
  _List_const_iterator<std::filesystem::__cxx11::directory_entry> local_48;
  _Self local_40;
  _List_const_iterator<std::filesystem::__cxx11::directory_entry> itr;
  _Self local_30;
  string *local_28;
  string *outputText_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *processed_local;
  string *include_local;
  list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  *dirEntries_local;
  
  local_28 = outputText;
  outputText_local = (string *)processed;
  processed_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)include;
  include_local = (string *)dirEntries;
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(processed,include);
  itr._M_node = (_List_node_base *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)outputText_local);
  bVar1 = std::operator!=(&local_30,(_Self *)&itr);
  if (!bVar1) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
         ::begin((list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                  *)include_local);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
         ::end((list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                *)include_local);
    std::__cxx11::string::string(local_70,(string *)processed_local);
    local_40._M_node =
         (_List_node_base *)
         std::
         find_if<std::_List_const_iterator<std::filesystem::__cxx11::directory_entry>,Heady::Detail::FindAndProcessLocalIncludes(std::__cxx11::list<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>const&,std::__cxx11::string_const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)::_lambda(auto:1_const&)_1_>
                   (local_48,local_50,(anon_class_32_1_f7238788_for__M_pred *)local_70);
    FindAndProcessLocalIncludes(std::__cxx11::list<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>const&,std::__cxx11::string_const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
    ::{lambda(auto:1_const&)#1}::~set((_lambda_auto_1_const___1_ *)local_70);
    local_88[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
         ::end((list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                *)include_local);
    bVar1 = std::operator!=(&local_40,local_88);
    dirEntries_00 = include_local;
    if (bVar1) {
      dirEntry = std::_List_const_iterator<std::filesystem::__cxx11::directory_entry>::operator*
                           (&local_40);
      FindAndProcessLocalIncludes
                ((list<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                  *)dirEntries_00,dirEntry,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)outputText_local,local_28);
    }
  }
  return;
}

Assistant:

inline void FindAndProcessLocalIncludes(const std::list<std::filesystem::directory_entry> & dirEntries, const std::string & include, std::set<std::string> & processed, std::string & outputText)
		{
			// Check to see if we've already processed this file
			if (processed.find(include) != processed.end())
				return;

			// Find the directory entry that matches this include filename, and if found, process it
			auto itr = std::find_if(dirEntries.begin(), dirEntries.end(), [include](const auto & entry)
			{
				return EndsWith(entry.path().string(), include);
			});
			if (itr != dirEntries.end())
			{
				FindAndProcessLocalIncludes(dirEntries, *itr, processed, outputText);
			}
		}